

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScheduledReporter.cc
# Opt level: O2

void __thiscall cppmetrics::ScheduledReporter::start(ScheduledReporter *this)

{
  thread local_30;
  long *local_28;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->m_mutex);
  if (this->m_is_running == false) {
    this->m_is_running = true;
    local_30._M_id._M_thread = (id)0;
    local_28 = (long *)operator_new(0x10);
    *local_28 = (long)&PTR___State_0012bc20;
    local_28[1] = (long)this;
    std::thread::_M_start_thread(&local_30,&local_28,0);
    if (local_28 != (long *)0x0) {
      (**(code **)(*local_28 + 8))();
    }
    std::thread::operator=(&this->m_reporter_thread,&local_30);
    std::thread::~thread(&local_30);
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return;
}

Assistant:

void ScheduledReporter::start()
{
  std::unique_lock<std::mutex> lock(m_mutex);
  if (!m_is_running)
  {
    m_is_running = true;
    m_reporter_thread = std::thread([&]() {
      loop_while_running();
    });
  }
}